

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O2

BGwCI_sharedPtr __thiscall BayesianGameWithClusterInfo::Cluster(BayesianGameWithClusterInfo *this)

{
  BayesianGameIdenticalPayoff *this_00;
  uint uVar1;
  value_type vVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  pointer ppTVar5;
  int iVar6;
  Index IVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar8;
  reference pvVar9;
  BayesianGameWithClusterInfo *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_03;
  size_type __n;
  ulong uVar10;
  const_reference pvVar11;
  reference ppvVar12;
  reference ppTVar13;
  reference pvVar14;
  reference ppJVar15;
  value_type pJVar16;
  undefined4 extraout_var_01;
  pointer ppTVar17;
  shared_count extraout_RDX;
  ulong uVar18;
  BayesianGameWithClusterInfo *in_RSI;
  Index jaI;
  uint uVar19;
  uint uVar20;
  ulong __n_00;
  double extraout_XMM0_Qa;
  double p;
  BGwCI_sharedPtr BVar21;
  allocator_type local_95;
  value_type_conflict1 local_94;
  BayesianGameWithClusterInfo *local_90;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *local_88;
  TypeClusterList *newTypeList;
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  newTypeLists;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrNewTypes;
  
  newTypeLists.
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(in_RSI->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff;
  newTypeLists.
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newTypeLists.
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90 = in_RSI;
  iVar6 = (*(in_RSI->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
            super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])(this_00);
  newTypeList = (TypeClusterList *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&nrNewTypes,CONCAT44(extraout_var,iVar6),(value_type_conflict2 *)&newTypeList,
             (allocator_type *)&local_94);
  uVar19 = 0;
  while( true ) {
    iVar6 = (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(this_00);
    if (CONCAT44(extraout_var_00,iVar6) <= (ulong)uVar19) break;
    newTypeList = (TypeClusterList *)operator_new(0x18);
    (newTypeList->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (newTypeList->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (newTypeList->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
    ::push_back(&newTypeLists,&newTypeList);
    sVar8 = ConstructClusteredIndividualTypes(local_90,uVar19,newTypeList);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (&nrNewTypes,(ulong)uVar19);
    *pvVar9 = sVar8;
    uVar19 = uVar19 + 1;
  }
  this_01 = (BayesianGameWithClusterInfo *)operator_new(0x1c8);
  BayesianGameWithClusterInfo
            (this_01,(local_90->super_BayesianGameForDecPOMDPStage)._m_pu,
             (local_90->super_BayesianGameForDecPOMDPStage)._m_qHeuristic,
             (local_90->super_BayesianGameForDecPOMDPStage).
             super_BayesianGameForDecPOMDPStageInterface._m_t,&local_90->_m_pBG,
             &local_90->_m_pBGJPol,
             (local_90->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
             super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrAgents,
             &(local_90->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrActions,
             &nrNewTypes,local_90->_m_clusterAlgorithm,local_90->_m_thresholdJB,
             local_90->_m_thresholdPjaoh);
  boost::shared_ptr<BayesianGameWithClusterInfo>::shared_ptr<BayesianGameWithClusterInfo>
            ((shared_ptr<BayesianGameWithClusterInfo> *)this,this_01);
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::operator=((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
               *)((this->super_BayesianGameForDecPOMDPStage).
                  super_BayesianGameForDecPOMDPStageInterface.
                  _vptr_BayesianGameForDecPOMDPStageInterface + 0x33),&newTypeLists);
  uVar19 = 0;
  local_88 = &(local_90->super_BayesianGameForDecPOMDPStage)._m_JBs;
  this_02 = &local_90->_m_jaohReps;
  while( true ) {
    sVar8 = BayesianGameBase::GetNrJointTypes
                      ((BayesianGameBase *)
                       ((this->super_BayesianGameForDecPOMDPStage).
                        super_BayesianGameForDecPOMDPStageInterface.
                        _vptr_BayesianGameForDecPOMDPStageInterface + 4));
    uVar18 = (ulong)uVar19;
    if (sVar8 <= uVar18) break;
    this_03 = BayesianGameBase::JointToIndividualTypeIndices
                        ((BayesianGameBase *)
                         ((this->super_BayesianGameForDecPOMDPStage).
                          super_BayesianGameForDecPOMDPStageInterface.
                          _vptr_BayesianGameForDecPOMDPStageInterface + 4),uVar19);
    pp_Var3 = (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface
              ._vptr_BayesianGameForDecPOMDPStageInterface;
    __n = (**(code **)(pp_Var3[4] + 0x18))(pp_Var3 + 4);
    local_94 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&newTypeList,__n,&local_94,
               &local_95);
    uVar20 = 0;
    while( true ) {
      pp_Var3 = (this->super_BayesianGameForDecPOMDPStage).
                super_BayesianGameForDecPOMDPStageInterface.
                _vptr_BayesianGameForDecPOMDPStageInterface;
      uVar10 = (**(code **)(pp_Var3[4] + 0x18))(pp_Var3 + 4);
      __n_00 = (ulong)uVar20;
      if (uVar10 <= __n_00) break;
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_03,__n_00);
      uVar1 = *pvVar11;
      ppvVar12 = std::
                 vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                       *)((this->super_BayesianGameForDecPOMDPStage).
                          super_BayesianGameForDecPOMDPStageInterface.
                          _vptr_BayesianGameForDecPOMDPStageInterface + 0x33),__n_00);
      ppTVar13 = std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::at
                           (*ppvVar12,(ulong)uVar1);
      IVar7 = (*ppTVar13)->_m_i;
      pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&newTypeList,
                           __n_00);
      *pvVar14 = IVar7;
      uVar20 = uVar20 + 1;
    }
    p = extraout_XMM0_Qa;
    IVar7 = BayesianGameBase::IndividualToJointTypeIndices
                      ((BayesianGameBase *)this_00,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&newTypeList);
    (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this_00,(ulong)IVar7);
    BayesianGameBase::SetProbability
              ((BayesianGameBase *)
               ((this->super_BayesianGameForDecPOMDPStage).
                super_BayesianGameForDecPOMDPStageInterface.
                _vptr_BayesianGameForDecPOMDPStageInterface + 4),uVar19,p);
    uVar10 = (ulong)IVar7;
    ppJVar15 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                         (local_88,uVar10);
    if (*ppJVar15 != (value_type)0x0) {
      ppJVar15 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                           (local_88,uVar10);
      pJVar16 = (value_type)(**(code **)((long)**ppJVar15 + 0xb8))();
      ppJVar15 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                           ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                             *)((this->super_BayesianGameForDecPOMDPStage).
                                super_BayesianGameForDecPOMDPStageInterface.
                                _vptr_BayesianGameForDecPOMDPStageInterface + 0x23),uVar18);
      *ppJVar15 = pJVar16;
    }
    if (local_90->_m_qJB == (QFunctionJointBeliefInterface *)0x0) {
      pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_02,uVar10);
      vVar2 = *pvVar14;
      pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           ((this->super_BayesianGameForDecPOMDPStage).
                            super_BayesianGameForDecPOMDPStageInterface.
                            _vptr_BayesianGameForDecPOMDPStageInterface + 0x30),uVar18);
      *pvVar14 = vVar2;
    }
    uVar18 = 0;
    while( true ) {
      sVar8 = BayesianGameBase::GetNrJointActions
                        ((BayesianGameBase *)
                         ((this->super_BayesianGameForDecPOMDPStage).
                          super_BayesianGameForDecPOMDPStageInterface.
                          _vptr_BayesianGameForDecPOMDPStageInterface + 4));
      if (sVar8 <= uVar18) break;
      (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0x10])(this_00,(ulong)IVar7,uVar18);
      p_Var4 = (this->super_BayesianGameForDecPOMDPStage).
               super_BayesianGameForDecPOMDPStageInterface.
               _vptr_BayesianGameForDecPOMDPStageInterface[0x20];
      (**(code **)(*(long *)p_Var4 + 8))(p_Var4,uVar19,uVar18);
      uVar18 = (ulong)((int)uVar18 + 1);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&newTypeList);
    uVar19 = uVar19 + 1;
  }
  uVar19 = 0;
  while( true ) {
    iVar6 = (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(this_00);
    pp_Var3 = (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface
              ._vptr_BayesianGameForDecPOMDPStageInterface;
    if (CONCAT44(extraout_var_01,iVar6) <= (ulong)uVar19) break;
    ppvVar12 = std::
               vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
               ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                     *)(pp_Var3 + 0x33),(ulong)uVar19);
    IVar7 = 0;
    ppTVar5 = ((*ppvVar12)->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar17 = ((*ppvVar12)->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start; ppTVar17 != ppTVar5;
        ppTVar17 = ppTVar17 + 1) {
      (*ppTVar17)->_m_i = IVar7;
      IVar7 = IVar7 + 1;
    }
    uVar19 = uVar19 + 1;
  }
  (**(code **)(pp_Var3[4] + 0x78))(pp_Var3 + 4);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&nrNewTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  _Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::~_Vector_base(&newTypeLists.
                   super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 );
  BVar21.pn.pi_ = extraout_RDX.pi_;
  BVar21.px = this;
  return BVar21;
}

Assistant:

BGwCI_sharedPtr  
BayesianGameWithClusterInfo::Cluster() 
{
    //first construct new clustered individual type set for each agent
    std::vector< TypeClusterList* > newTypeLists;
    std::vector< size_t > nrNewTypes(GetNrAgents(), 0);

    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        //we create a new (empty) TypeClusterList for this agent.
        TypeClusterList* newTypeList = new TypeClusterList();
        newTypeLists.push_back(newTypeList);
        nrNewTypes.at(agI) = ConstructClusteredIndividualTypes(agI, 
                newTypeList);
    }

    BGwCI_sharedPtr bgc(new BayesianGameWithClusterInfo(
            GetPUDecPOMDPDiscrete(),
            GetQHeur(),
            GetStage(),
            _m_pBG,
            _m_pBGJPol,
            _m_nrAgents,
            _m_nrActions,
            nrNewTypes,
            _m_clusterAlgorithm,
            _m_thresholdJB,
            _m_thresholdPjaoh
                            ));

#if BGCLUSTER_OUTPUT_CLUSTERSTATS
    cout << GetStage() << " " << bgc->GetNrJointTypes()
         << "      stage " << GetStage()
         << " nrNewTypes " << SoftPrintVector(nrNewTypes)
         << " old nrJointTypes " << GetNrJointTypes()
         << " new nrJointTypes " << bgc->GetNrJointTypes()
         << endl;
#endif

    bgc->_m_typeLists = newTypeLists;


    //copy all the relevant stuff from the original BG (from *this*)
    //the the new clustered one (bgc)
    for(Index jtcI=0; jtcI < bgc->GetNrJointTypes(); jtcI++)
    {
        //find corresponding jtcI in the original BG (i.e., in this)
        const vector<Index>& indTypes = bgc->JointToIndividualTypeIndices(jtcI);
        vector<Index> previousTCI(bgc->GetNrAgents(), 0 );
        for(Index agI=0; agI < bgc->GetNrAgents(); agI++)
        {
            Index tcI = indTypes.at(agI);
            TypeClusterList* tcl = bgc->_m_typeLists.at(agI);
            TypeCluster* tc = tcl->at(tcI);
            Index previousIndexOfThisTC = tc->GetIndex();
            previousTCI.at(agI) = previousIndexOfThisTC;
        }
        Index previousjtcI = this->IndividualToJointTypeIndices(
                previousTCI);
        //
        double p = this->GetProbability(previousjtcI);
        bgc->SetProbability( jtcI, p);
        ///make a deep copy of the joint beliefs!
        //bgc->_m_JBs.at(jtcI) = this->_m_JBs.at(previousjtcI);
        if(this->_m_JBs.at(previousjtcI))
        {
            JointBeliefInterface* jbcopy =  (this->_m_JBs.at(previousjtcI))->Clone();
            bgc->_m_JBs.at(jtcI) = jbcopy;
        }

        // only maintain jaohRep if we are actually going to use them
        if(!_m_qJB)
            bgc->_m_jaohReps.at(jtcI) = this->_m_jaohReps.at(previousjtcI);

        for(Index jaI=0; jaI < bgc->GetNrJointActions(); jaI++)
        {
            double u = this->GetUtility(previousjtcI, jaI);
            bgc->SetUtility(jtcI, jaI, u);
        }

    }

    ///renumber the typeclusters for each agent
    for(Index agI=0; agI < GetNrAgents(); agI++)
    {

        TypeClusterList* tcl = bgc->_m_typeLists.at(agI);
        Index i = 0;
        TypeClusterList::iterator it = tcl->begin();
        TypeClusterList::iterator last = tcl->end();
        while(it != last)
        {
            TypeCluster* tc = *it;
            tc->SetIndex(i);
            i++;
            it++;
        }
    }
      
    bgc->SanityCheck();
    

    return bgc;
    //return this;
}